

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O2

void __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::solveFullBranchingProblemAndUpdateLabels
          (PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
           *this)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  pointer pEVar1;
  uchar *label;
  pointer __args;
  double dVar2;
  BranchingOptimizer branchingOptimizer;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  HungarianBranching<lineage::heuristics::PartitionGraph> local_58;
  
  branching::HungarianBranching<lineage::heuristics::PartitionGraph>::HungarianBranching
            (&local_58,&this->partitionGraph_);
  dVar2 = branching::HungarianBranching<lineage::heuristics::PartitionGraph>::optimize(&local_58);
  this->branchingObjective_ = dVar2;
  pEVar1 = (this->partitionGraph_).super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.
           edges_.
           super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->partitionGraph_).branchingLabels_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (this->partitionGraph_).branchingLabels_.super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  *(uint *)((long)&(this->partitionGraph_).branchingLabels_.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  this_00 = &(this->partitionGraph_).branchingLabels_;
  std::vector<bool,_std::allocator<bool>_>::reserve
            (this_00,(long)pEVar1 -
                     (long)(this->partitionGraph_).
                           super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.edges_.
                           super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70,&local_58.solution_)
  ;
  for (__args = local_70._M_impl.super__Vector_impl_data._M_start;
      __args != local_70._M_impl.super__Vector_impl_data._M_finish; __args = __args + 1) {
    std::vector<bool,std::allocator<bool>>::emplace_back<unsigned_char&>
              ((vector<bool,std::allocator<bool>> *)this_00,__args);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_70);
  branching::HungarianBranching<lineage::heuristics::PartitionGraph>::~HungarianBranching(&local_58)
  ;
  return;
}

Assistant:

inline void
PartitionOptimizerBase<BROPT>::solveFullBranchingProblemAndUpdateLabels()
{
    auto branchingOptimizer = BranchingOptimizer(partitionGraph_);
    branchingObjective_ = branchingOptimizer.optimize();

    partitionGraph_.branchingLabels_.clear();
    partitionGraph_.branchingLabels_.reserve(partitionGraph_.numberOfEdges());

    for (auto&& label : branchingOptimizer.getSolution()) {
        partitionGraph_.branchingLabels_.emplace_back(label);
    }
}